

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

size_t flvtag_header_size(flvtag_t *tag)

{
  byte bVar1;
  flvtag_codecid_t fVar2;
  flvtag_frametype_t fVar3;
  size_t sStack_10;
  
  bVar1 = *tag->data & 0x1f;
  if (bVar1 == 9) {
    fVar2 = flvtag_codecid(tag);
    if (fVar2 == flvtag_codecid_avc) {
      fVar3 = flvtag_frametype(tag);
      sStack_10 = (ulong)(fVar3 != flvtag_frametype_commandframe) * 3 + 0xd;
    }
    else {
      sStack_10 = 0xc;
    }
  }
  else if (bVar1 == 8) {
    sStack_10 = (ulong)(*tag->data == 0xa8) | 0xc;
  }
  else {
    sStack_10 = 0xb;
  }
  return sStack_10;
}

Assistant:

size_t flvtag_header_size(flvtag_t* tag)
{
    switch (flvtag_type(tag)) {
    case flvtag_type_audio:
        return FLV_TAG_HEADER_SIZE + (flvtag_soundformat_aac != flvtag_soundformat(tag) ? 1 : 2);

    case flvtag_type_video:
        // CommandFrame does not have a compositionTime
        return FLV_TAG_HEADER_SIZE + (flvtag_codecid_avc != flvtag_codecid(tag) ? 1 : (flvtag_frametype_commandframe != flvtag_frametype(tag) ? 5 : 2));

    default:
        return FLV_TAG_HEADER_SIZE;
    }
}